

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool IsBIP30Repeat(CBlockIndex *block_index)

{
  long lVar1;
  bool bVar2;
  base_blob<256U> *in_RDI;
  long in_FS_OFFSET;
  bool local_92;
  bool local_91;
  undefined1 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff79;
  undefined1 in_stack_ffffffffffffff7a;
  undefined1 in_stack_ffffffffffffff7b;
  undefined1 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)((in_RDI->m_data)._M_elems + 0x18) == 0x166c2) {
    CBlockIndex::GetBlockHash
              ((CBlockIndex *)
               CONCAT17(in_stack_ffffffffffffff7f,
                        CONCAT16(in_stack_ffffffffffffff7e,
                                 CONCAT15(in_stack_ffffffffffffff7d,
                                          CONCAT14(in_stack_ffffffffffffff7c,
                                                   CONCAT13(in_stack_ffffffffffffff7b,
                                                            CONCAT12(in_stack_ffffffffffffff7a,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
    bVar2 = operator==((base_blob<256U> *)
                       CONCAT17(in_stack_ffffffffffffff7f,
                                CONCAT16(in_stack_ffffffffffffff7e,
                                         CONCAT15(in_stack_ffffffffffffff7d,
                                                  CONCAT14(in_stack_ffffffffffffff7c,
                                                           CONCAT13(in_stack_ffffffffffffff7b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff7a,
                                                  CONCAT11(in_stack_ffffffffffffff79,
                                                           in_stack_ffffffffffffff78))))))),in_RDI);
    local_91 = true;
    if (bVar2) goto LAB_007d4dc4;
  }
  local_92 = false;
  if (*(int *)((in_RDI->m_data)._M_elems + 0x18) == 0x166e8) {
    CBlockIndex::GetBlockHash
              ((CBlockIndex *)
               CONCAT17(in_stack_ffffffffffffff7f,
                        CONCAT16(in_stack_ffffffffffffff7e,
                                 CONCAT15(in_stack_ffffffffffffff7d,
                                          CONCAT14(in_stack_ffffffffffffff7c,
                                                   CONCAT13(in_stack_ffffffffffffff7b,
                                                            CONCAT12(in_stack_ffffffffffffff7a,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
    local_92 = operator==((base_blob<256U> *)0x6a38084ccb7cd721,in_RDI);
  }
  local_91 = local_92;
LAB_007d4dc4:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_91;
  }
  __stack_chk_fail();
}

Assistant:

bool IsBIP30Repeat(const CBlockIndex& block_index)
{
    return (block_index.nHeight==91842 && block_index.GetBlockHash() == uint256{"00000000000a4d0a398161ffc163c503763b1f4360639393e0e4c8e300e0caec"}) ||
           (block_index.nHeight==91880 && block_index.GetBlockHash() == uint256{"00000000000743f190a18c5577a3c2d2a1f610ae9601ac046a38084ccb7cd721"});
}